

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_write_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t sVar1;
  ulong uVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  byte bVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  sVar1 = X->n;
  uVar2 = sVar1 * 8;
  uVar7 = uVar2;
  if (uVar2 < buflen) {
LAB_00117cdc:
    bVar5 = 0;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      buf[uVar8] = (uchar)(*(ulong *)((long)X->p + (uVar8 & 0xfffffffffffffff8)) >> (bVar5 & 0x38));
      bVar5 = bVar5 + 8;
    }
    iVar3 = 0;
    __n = buflen + sVar1 * -8;
    if (uVar2 <= buflen && __n != 0) {
      iVar3 = 0;
      memset(buf + uVar2,0,__n);
    }
  }
  else {
    lVar4 = buflen * 8;
    iVar3 = -8;
    sVar6 = buflen;
    do {
      uVar7 = buflen;
      if (uVar2 == sVar6) goto LAB_00117cdc;
      uVar7 = sVar6 & 0xfffffffffffffff8;
      bVar5 = (byte)lVar4;
      sVar6 = sVar6 + 1;
      lVar4 = lVar4 + 8;
    } while ((char)(*(ulong *)((long)X->p + uVar7) >> (bVar5 & 0x38)) == '\0');
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_write_binary_le( const mbedtls_mpi *X,
                                 unsigned char *buf, size_t buflen )
{
    size_t stored_bytes = X->n * ciL;
    size_t bytes_to_copy;
    size_t i;

    if( stored_bytes < buflen )
    {
        bytes_to_copy = stored_bytes;
    }
    else
    {
        bytes_to_copy = buflen;

        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        for( i = bytes_to_copy; i < stored_bytes; i++ )
        {
            if( GET_BYTE( X, i ) != 0 )
                return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }
    }

    for( i = 0; i < bytes_to_copy; i++ )
        buf[i] = GET_BYTE( X, i );

    if( stored_bytes < buflen )
    {
        /* Write trailing 0 bytes */
        memset( buf + stored_bytes, 0, buflen - stored_bytes );
    }

    return( 0 );
}